

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O1

vector<std::pair<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
* __thiscall
cappuccino::tlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::
find_range<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (vector<std::pair<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *__return_storage_ptr__,
          tlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *key_range,peek peek)

{
  pointer puVar1;
  int iVar2;
  time_point now;
  undefined8 uVar3;
  pointer key;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_58;
  bool local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::reserve(__return_storage_ptr__,
            (long)(key_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(key_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3);
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    key = (key_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start;
    puVar1 = (key_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (key != puVar1) {
      do {
        tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
        ::do_find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58,
                  (tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                   *)this,key,now,peek);
        std::
        vector<std::pair<unsigned_long,std::optional<std::__cxx11::string>>,std::allocator<std::pair<unsigned_long,std::optional<std::__cxx11::string>>>>
        ::emplace_back<unsigned_long_const&,std::optional<std::__cxx11::string>>
                  ((vector<std::pair<unsigned_long,std::optional<std::__cxx11::string>>,std::allocator<std::pair<unsigned_long,std::optional<std::__cxx11::string>>>>
                    *)__return_storage_ptr__,key,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58);
        if (local_38 == true) {
          local_38 = false;
          if (local_58._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_58._M_value + 0x10))
          {
            operator_delete((void *)local_58._M_value._M_dataplus._M_p,local_58._16_8_ + 1);
          }
        }
        key = key + 1;
      } while (key != puVar1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return __return_storage_ptr__;
  }
  uVar3 = std::__throw_system_error(iVar2);
  std::
  vector<std::pair<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(__return_storage_ptr__);
  _Unwind_Resume(uVar3);
}

Assistant:

auto find_range(const range_type& key_range, peek peek = peek::no)
        -> std::vector<std::pair<key_type, std::optional<value_type>>>
    {
        std::vector<std::pair<key_type, std::optional<value_type>>> output;
        output.reserve(std::size(key_range));

        auto now = std::chrono::steady_clock::now();

        {
            std::lock_guard guard{m_lock};
            for (auto& key : key_range)
            {
                output.emplace_back(key, do_find(key, now, peek));
            }
        }

        return output;
    }